

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::findOrCreateLightSource(SemanticParser *this,SP *in)

{
  mapped_type *pmVar1;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_00;
  map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  *this_00;
  SP SVar3;
  
  if ((element_type *)(in_RDX._M_pi)->_vptr__Sp_counted_base == (element_type *)0x0) {
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
               *)(in + 5);
    pmVar1 = std::
             map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
             ::operator[](this_00,(key_type *)in_RDX._M_pi);
    if ((pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      in_00 = in_RDX._M_pi;
      std::__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffd0,
                 (__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
                 in_RDX._M_pi);
      createLightSourceFrom((SemanticParser *)&stack0xffffffffffffffc0,(SP *)in_00);
      p_Var2 = &std::
                map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
                ::operator[](this_00,(key_type *)in_RDX._M_pi)->
                super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var2,(__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
                        &stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
    }
    p_Var2 = &std::
              map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
              ::operator[](this_00,(key_type *)in_RDX._M_pi)->
              super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    in_RDX._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::findOrCreateLightSource(pbrt::syntactic::LightSource::SP in)
  {
    if (!in)
      return LightSource::SP();

    if (!lightSourceMapping[in]) {
      lightSourceMapping[in] = createLightSourceFrom(in);
    }
    return lightSourceMapping[in];
  }